

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O0

bool crnlib::create_compressed_texture
               (crn_comp_params *params,crn_mipmap_params *mipmap_params,
               vector<unsigned_char> *comp_data,uint32 *pActual_quality_level,float *pActual_bitrate
               )

{
  bool bVar1;
  uint uVar2;
  mip_level *this;
  image_u8 *this_00;
  color_quad<unsigned_char,_int> *pcVar3;
  uint local_410;
  uint local_40c;
  uint l;
  uint f;
  crn_comp_params new_params;
  undefined1 local_80 [8];
  mipmapped_texture work_tex;
  float *pActual_bitrate_local;
  uint32 *pActual_quality_level_local;
  vector<unsigned_char> *comp_data_local;
  crn_mipmap_params *mipmap_params_local;
  crn_comp_params *params_local;
  
  work_tex.m_last_error.m_pStr = (char *)pActual_bitrate;
  vector<unsigned_char>::resize(comp_data,0,false);
  if (work_tex.m_last_error.m_pStr != (char *)0x0) {
    work_tex.m_last_error.m_pStr[0] = '\0';
    work_tex.m_last_error.m_pStr[1] = '\0';
    work_tex.m_last_error.m_pStr[2] = '\0';
    work_tex.m_last_error.m_pStr[3] = '\0';
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  mipmapped_texture::mipmapped_texture((mipmapped_texture *)local_80);
  bVar1 = create_dds_tex(params,(mipmapped_texture *)local_80);
  if (bVar1) {
    bVar1 = create_texture_mipmaps((mipmapped_texture *)local_80,params,mipmap_params,true);
    if (bVar1) {
      memcpy(&l,params,0x378);
      new_params.m_width = mipmapped_texture::get_num_levels((mipmapped_texture *)local_80);
      memset(&new_params.m_flags,0,0x300);
      local_40c = 0;
      while( true ) {
        uVar2 = mipmapped_texture::get_num_faces((mipmapped_texture *)local_80);
        if (uVar2 <= local_40c) break;
        local_410 = 0;
        while( true ) {
          uVar2 = mipmapped_texture::get_num_levels((mipmapped_texture *)local_80);
          if (uVar2 <= local_410) break;
          this = mipmapped_texture::get_level((mipmapped_texture *)local_80,local_40c,local_410);
          this_00 = mip_level::get_image(this);
          pcVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(this_00);
          new_params.m_pImages[(ulong)local_40c - 1][(ulong)local_410 + 0xf] = (crn_uint32 *)pcVar3;
          local_410 = local_410 + 1;
        }
        local_40c = local_40c + 1;
      }
      params_local._7_1_ =
           create_compressed_texture
                     ((crn_comp_params *)&l,comp_data,pActual_quality_level,
                      (float *)work_tex.m_last_error.m_pStr);
    }
    else {
      params_local._7_1_ = false;
    }
  }
  else {
    console::error("Failed creating DDS texture from crn_comp_params!");
    params_local._7_1_ = false;
  }
  new_params.m_pProgress_func_data._0_4_ = 1;
  mipmapped_texture::~mipmapped_texture((mipmapped_texture *)local_80);
  return params_local._7_1_;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, const crn_mipmap_params& mipmap_params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate)
    {
        comp_data.resize(0);
        if (pActual_bitrate)
        {
            *pActual_bitrate = 0.0f;
        }
        if (pActual_quality_level)
        {
            *pActual_quality_level = 0;
        }

        mipmapped_texture work_tex;
        if (!create_dds_tex(params, work_tex))
        {
            console::error("Failed creating DDS texture from crn_comp_params!");
            return false;
        }

        if (!create_texture_mipmaps(work_tex, params, mipmap_params, true))
        {
            return false;
        }

        crn_comp_params new_params(params);
        new_params.m_levels = work_tex.get_num_levels();
        memset(new_params.m_pImages, 0, sizeof(new_params.m_pImages));

        for (uint f = 0; f < work_tex.get_num_faces(); f++)
        {
            for (uint l = 0; l < work_tex.get_num_levels(); l++)
            {
                new_params.m_pImages[f][l] = (uint32*)work_tex.get_level(f, l)->get_image()->get_ptr();
            }
        }

        return create_compressed_texture(new_params, comp_data, pActual_quality_level, pActual_bitrate);
    }